

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

int secp256k1_ge_eq_var(secp256k1_ge *a,secp256k1_ge *b)

{
  int iVar1;
  secp256k1_fe *in_RSI;
  secp256k1_fe *in_RDI;
  secp256k1_fe tmp;
  undefined1 auStack_48 [8];
  secp256k1_ge *in_stack_ffffffffffffffc0;
  int local_4;
  
  secp256k1_ge_verify(in_stack_ffffffffffffffc0);
  secp256k1_ge_verify(in_stack_ffffffffffffffc0);
  if ((int)in_RDI[2].n[0] == (int)in_RSI[2].n[0]) {
    if ((int)in_RDI[2].n[0] == 0) {
      memcpy(auStack_48,in_RDI,0x30);
      secp256k1_fe_normalize_weak((secp256k1_fe *)0x10dbc0);
      iVar1 = secp256k1_fe_equal(in_RDI,in_RSI);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        memcpy(auStack_48,in_RDI + 1,0x30);
        secp256k1_fe_normalize_weak((secp256k1_fe *)0x10dbfa);
        iVar1 = secp256k1_fe_equal(in_RDI,in_RSI);
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int secp256k1_ge_eq_var(const secp256k1_ge *a, const secp256k1_ge *b) {
    secp256k1_fe tmp;
    SECP256K1_GE_VERIFY(a);
    SECP256K1_GE_VERIFY(b);

    if (a->infinity != b->infinity) return 0;
    if (a->infinity) return 1;

    tmp = a->x;
    secp256k1_fe_normalize_weak(&tmp);
    if (!secp256k1_fe_equal(&tmp, &b->x)) return 0;

    tmp = a->y;
    secp256k1_fe_normalize_weak(&tmp);
    if (!secp256k1_fe_equal(&tmp, &b->y)) return 0;

    return 1;
}